

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool string_find_replace(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_fiber_t *fiber;
  char *s;
  undefined6 in_register_00000012;
  _Bool _Var1;
  gravity_value_t value;
  gravity_value_t value_00;
  size_t len;
  size_t local_1018;
  char acStack_1010 [4088];
  
  if ((((int)CONCAT62(in_register_00000012,nargs) == 3) && (args[1].isa == gravity_class_string)) &&
     (args[2].isa == args[1].isa)) {
    local_1018 = 0;
    s = string_replace((char *)((args->field_1).p)->objclass,(char *)(args[1].field_1.p)->objclass,
                       (char *)(args[2].field_1.p)->objclass,&local_1018);
    if (local_1018 == 0 || s == (char *)0x0) {
      value_00.field_1.n = 0;
      value_00.isa = gravity_class_null;
    }
    else {
      value_00 = gravity_string_to_value(vm,s,(uint32_t)local_1018);
    }
    gravity_vm_setslot(vm,value_00,rindex);
    _Var1 = true;
  }
  else {
    builtin_strncpy(acStack_1010 + 0x18,"g arguments.",0xd);
    builtin_strncpy(acStack_1010 + 8," expects 2 strin",0x10);
    local_1018._0_1_ = 'S';
    local_1018._1_1_ = 't';
    local_1018._2_1_ = 'r';
    local_1018._3_1_ = 'i';
    local_1018._4_1_ = 'n';
    local_1018._5_1_ = 'g';
    local_1018._6_1_ = '.';
    local_1018._7_1_ = 'r';
    builtin_strncpy(acStack_1010,"eplace()",8);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,(char *)&local_1018);
    _Var1 = false;
    value.field_1.n = 0;
    value.isa = gravity_class_null;
    gravity_vm_setslot(vm,value,rindex);
  }
  return _Var1;
}

Assistant:

static bool string_find_replace (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    // sanity check
    if ((nargs != 3) || (!VALUE_ISA_STRING(GET_VALUE(1))) || (!VALUE_ISA_STRING(GET_VALUE(2)))) RETURN_ERROR("String.replace() expects 2 string arguments.");
    
    // setup arguments
    gravity_string_t *string = VALUE_AS_STRING(GET_VALUE(0));
    gravity_string_t *from = VALUE_AS_STRING(GET_VALUE(1));
    gravity_string_t *to = VALUE_AS_STRING(GET_VALUE(2));
    size_t len = 0;
    
    // perform search and replace
    char *s = string_replace(string->s, from->s, to->s, &len);
    
    // return result
    if (s && len) RETURN_VALUE(VALUE_FROM_STRING(vm, s, (uint32_t)len), rindex);
    RETURN_VALUE(VALUE_FROM_NULL, rindex);
}